

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall
lest::make_tuple_string<std::tuple<char,int,double,char_const*>,0ul>::make_abi_cxx11_
          (string *__return_storage_ptr__,
          make_tuple_string<std::tuple<char,int,double,char_const*>,0ul> *this,
          tuple<char,_int,_double,_const_char_*> *param_1)

{
  allocator local_31;
  char *local_30;
  size_type local_28;
  char local_20;
  undefined7 uStack_1f;
  undefined8 uStack_18;
  
  std::__cxx11::string::string((string *)&local_30,"",&local_31);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_30 == &local_20) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1f,local_20);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_18;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_30;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1f,local_20);
  }
  __return_storage_ptr__->_M_string_length = local_28;
  local_28 = 0;
  local_20 = '\0';
  local_30 = &local_20;
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string make( TU const & ) { return ""; }